

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O0

bool google::sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
               (_IO_FILE *fp,unsigned_long *value,size_t length)

{
  bool bVar1;
  _IO_FILE *in_RDX;
  ulong *in_RSI;
  size_t i;
  uchar byte;
  void *in_stack_ffffffffffffffc8;
  _IO_FILE *fp_00;
  byte local_21;
  
  *in_RSI = 0;
  fp_00 = (_IO_FILE *)0x0;
  while( true ) {
    if (in_RDX <= fp_00) {
      return true;
    }
    bVar1 = read_data<_IO_FILE>(fp_00,in_stack_ffffffffffffffc8,0x9c7548);
    if (!bVar1) break;
    *in_RSI = (ulong)local_21 << ((((char)in_RDX + -1) - (char)fp_00) * '\b' & 0x3fU) | *in_RSI;
    fp_00 = fp_00 + 1;
  }
  return false;
}

Assistant:

bool read_bigendian_number(INPUT* fp, IntType* value, size_t length) {
  *value = 0;
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    if (!read_data(fp, &byte, sizeof(byte))) return false;
    *value |= static_cast<IntType>(byte) << ((length - 1 - i) * 8);
  }
  return true;
}